

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__write_dump_data(stbi__write_context *s,int length,uchar *data)

{
  uchar lengthbyte;
  undefined1 local_19;
  
  local_19 = (undefined1)length;
  if (length < 0x81) {
    (*s->func)(s->context,&local_19,1);
    (*s->func)(s->context,data,length);
    return;
  }
  __assert_fail("length <= 128",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/RuiwenTang[P]TinyRender/third_party/stb_image_write.h"
                ,0x265,"void stbiw__write_dump_data(stbi__write_context *, int, unsigned char *)");
}

Assistant:

void stbiw__write_dump_data(stbi__write_context *s, int length,
                            unsigned char *data) {
  unsigned char lengthbyte = STBIW_UCHAR(length);
  STBIW_ASSERT(
      length <=
      128);  // inconsistent with spec but consistent with official code
  s->func(s->context, &lengthbyte, 1);
  s->func(s->context, data, length);
}